

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codim_mesh_data_set.h
# Opt level: O3

void __thiscall
lf::mesh::utils::
CodimMeshDataSet<std::vector<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_std::allocator<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>_>_>
::CodimMeshDataSet(CodimMeshDataSet<std::vector<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_std::allocator<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>_>_>
                   *this,shared_ptr<const_lf::mesh::Mesh> *mesh,dim_t codim)

{
  element_type *peVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  uint uVar6;
  ulong initial_capacity;
  
  (this->
  super_MeshDataSet<std::vector<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_std::allocator<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>_>_>
  )._vptr_MeshDataSet = (_func_int **)&PTR_operator___004d0598;
  (this->mesh_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uVar2 = *(undefined4 *)
           &(mesh->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar3 = *(undefined4 *)
           ((long)&(mesh->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr + 4);
  uVar4 = *(undefined4 *)
           &(mesh->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
            ._M_pi;
  uVar5 = *(undefined4 *)
           ((long)&(mesh->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi + 4);
  (mesh->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined4 *)
   &(this->mesh_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       uVar2;
  *(undefined4 *)
   ((long)&(this->mesh_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   + 4) = uVar3;
  *(undefined4 *)
   &(this->mesh_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = uVar4;
  *(undefined4 *)
   ((long)&(this->mesh_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi + 4) = uVar5;
  (mesh->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  peVar1 = (this->mesh_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  uVar6 = (*peVar1->_vptr_Mesh[3])(peVar1,(ulong)codim);
  initial_capacity = (ulong)uVar6;
  (this->data_).m_holder.m_start = (pointer)0x0;
  (this->data_).m_holder.m_size = initial_capacity;
  (this->data_).m_holder.m_capacity = 0;
  boost::container::
  vector_alloc_holder<boost::container::new_allocator<std::vector<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_std::allocator<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>_>_>,_unsigned_long,_boost::move_detail::integral_constant<unsigned_int,_1U>_>
  ::do_initial_capacity<unsigned_long>(&(this->data_).m_holder,initial_capacity);
  if (uVar6 != 0) {
    memset((this->data_).m_holder.m_start,0,initial_capacity * 0x18);
  }
  this->codim_ = codim;
  return;
}

Assistant:

CodimMeshDataSet(std::shared_ptr<const Mesh> mesh, dim_t codim)
      : MeshDataSet<T>(),
        mesh_(std::move(mesh)),
        data_(mesh_->NumEntities(codim)),
        codim_(codim) {}